

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall
Catch::Generators::RandomFloatingGenerator<long_double>::next
          (RandomFloatingGenerator<long_double> *this)

{
  longdouble lVar1;
  PImpl *__return_storage_ptr__;
  SimplePcg32 *in_RSI;
  _Adaptor<Catch::SimplePcg32,_long_double> __aurng;
  longdouble in_ST0;
  
  __return_storage_ptr__ = (this->m_pimpl).m_ptr;
  std::generate_canonical<long_double,64ul,Catch::SimplePcg32>
            ((longdouble *)__return_storage_ptr__,in_RSI);
  lVar1 = (__return_storage_ptr__->dist)._M_param._M_a;
  this->m_current_number = in_ST0 * ((__return_storage_ptr__->dist)._M_param._M_b - lVar1) + lVar1;
  return true;
}

Assistant:

bool RandomFloatingGenerator<long double>::next() {
            m_current_number = m_pimpl->dist( m_pimpl->rng );
            return true;
        }